

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall sznet::net::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  self *psVar1;
  SourceFile file;
  undefined1 local_1048 [8];
  MutexLockGuard lock;
  undefined1 local_78 [12];
  Functor local_68;
  string local_48;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_loop !=
      ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_loop) {
    __assert_fail("m_loop == conn->getLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                  ,0x99,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
  }
  local_1048 = (undefined1  [8])&this->m_mutex;
  MutexLock::lock((MutexLock *)local_1048);
  if ((this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr ==
      (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_connection).
                super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
    MutexLockGuard::~MutexLockGuard((MutexLockGuard *)local_1048);
    this_00 = this->m_loop;
    local_48._M_dataplus._M_p = (pointer)TcpConnection::connectDestroyed;
    local_48._M_string_length = 0;
    std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    _Bind<std::shared_ptr<sznet::net::TcpConnection>const&>
              ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1048,(offset_in_TcpConnection_to_subr *)&local_48,conn);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_68,
               (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1048);
    EventLoop::queueInLoop(this_00,&local_68);
    std::_Function_base::~_Function_base(&local_68.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffefd0);
    if ((this->m_retry == true) && (this->m_connect == true)) {
      if (g_logLevel < 3) {
        Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_78,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                  );
        file._12_4_ = 0;
        file.m_data = (char *)local_78._0_8_;
        file.m_size = local_78._8_4_;
        Logger::Logger((Logger *)local_1048,file,0xa4);
        psVar1 = LogStream::operator<<((LogStream *)&lock,"TcpClient::connect[");
        psVar1 = LogStream::operator<<(psVar1,&this->m_name);
        psVar1 = LogStream::operator<<(psVar1,"] - Reconnecting to ");
        InetAddress::toIpPort_abi_cxx11_
                  (&local_48,
                   &((this->m_connector).
                     super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_serverAddr);
        LogStream::operator<<(psVar1,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        Logger::~Logger((Logger *)local_1048);
      }
      Connector::restart((this->m_connector).
                         super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    return;
  }
  __assert_fail("m_connection == conn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                ,0x9d,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	assert(m_loop == conn->getLoop());

	{
		MutexLockGuard lock(m_mutex);
		assert(m_connection == conn);
		m_connection.reset();
	}

	m_loop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	if (m_retry && m_connect)
	{
		LOG_INFO << "TcpClient::connect[" << m_name << "] - Reconnecting to "
				 << m_connector->serverAddress().toIpPort();
		m_connector->restart();
	}
}